

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_toclose(lua_State *L,int idx)

{
  short sVar1;
  StkId level;
  
  if (idx < 1) {
    level = (L->top).p + idx;
  }
  else {
    level = (L->ci->func).p + (uint)idx;
  }
  sVar1 = L->ci->nresults;
  luaF_newtbcupval(L,level);
  if (-2 < sVar1) {
    L->ci->nresults = -3 - sVar1;
  }
  return;
}

Assistant:

LUA_API void lua_toclose (lua_State *L, int idx) {
  int nresults;
  StkId o;
  lua_lock(L);
  o = index2stack(L, idx);
  nresults = L->ci->nresults;
  api_check(L, L->tbclist.p < o, "given index below or equal a marked one");
  luaF_newtbcupval(L, o);  /* create new to-be-closed upvalue */
  if (!hastocloseCfunc(nresults))  /* function not marked yet? */
    L->ci->nresults = codeNresults(nresults);  /* mark it */
  lua_assert(hastocloseCfunc(L->ci->nresults));
  lua_unlock(L);
}